

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O2

tokens __thiscall JSON::JSONScanner::ScanString(JSONScanner *this)

{
  char16 *pcVar1;
  uint *puVar2;
  char16 cVar3;
  code *pcVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  RangeCharacterPairList *pRVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  uint uVar14;
  uint uVar15;
  RangeCharacterPair local_44;
  int local_38;
  int local_34 [2];
  int tempHex;
  
  this->currentIndex = 0;
  pcVar12 = this->currentChar;
  this->currentString = pcVar12;
  uVar14 = 0;
  bVar7 = true;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pcVar13 = pcVar12;
LAB_00a39aad:
  do {
    pcVar11 = this->inputText + this->inputLen;
    if (pcVar11 <= pcVar13) {
LAB_00a39d7d:
      ThrowSyntaxError(this,-0x7ff5e9e7);
    }
    pcVar1 = pcVar13 + 1;
    this->currentChar = pcVar1;
    cVar3 = *pcVar13;
    if (cVar3 == L'\"') {
      if (bVar7) {
        this->currentIndex = uVar14;
        Output::TraceWithFlush
                  (JSONPhase,L"ScanString(): direct-mapped string as \'%.*s\'\n",(ulong)uVar14,
                   this->currentString);
      }
      else {
        if (uVar14 != 0) {
          pRVar10 = GetCurrentRangeCharacterPairList(this);
          local_44.m_rangeStart = (uint)((ulong)((long)pcVar12 - (long)this->inputText) >> 1);
          local_44.m_char = L'\0';
          local_44.m_rangeLength = uVar14;
          JsUtil::
          List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(pRVar10,&local_44);
          puVar2 = &this->currentIndex;
          uVar15 = *puVar2;
          *puVar2 = *puVar2 + uVar14;
          if (CARRY4(uVar15,uVar14)) goto LAB_00a39d63;
        }
        BuildUnescapedString(this,uVar14 != 0);
        pRVar10 = GetCurrentRangeCharacterPairList(this);
        (pRVar10->
        super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = 0;
        this->currentString = this->stringBuffer;
      }
      this->pToken->tk = tkStrCon;
      return tkStrCon;
    }
    if ((ushort)cVar3 < 0x20) {
switchD_00a39b59_caseD_6f:
      ThrowSyntaxError(this,-0x7ff5e9e9);
    }
    if (cVar3 != L'\\') {
      uVar14 = uVar14 + 1;
      pcVar13 = pcVar1;
      goto LAB_00a39aad;
    }
    if (pcVar11 <= pcVar1) goto LAB_00a39d7d;
    this->currentChar = pcVar13 + 2;
    cVar3 = pcVar13[1];
    uVar15 = (uint)(ushort)cVar3;
    switch(cVar3) {
    case L'n':
      uVar15 = 10;
      break;
    case L'o':
    case L'p':
    case L'q':
    case L's':
      goto switchD_00a39b59_caseD_6f;
    case L'r':
      uVar15 = 0xd;
      break;
    case L't':
      uVar15 = 9;
      break;
    case L'u':
      if (pcVar11 <= pcVar13 + 5) goto LAB_00a39d7d;
      this->currentChar = pcVar13 + 3;
      BVar8 = Js::NumberUtilities::FHexDigit(pcVar13[2],local_34);
      if (BVar8 == 0) {
LAB_00a39d68:
        ThrowSyntaxError(this,-0x7ff5e9e8);
      }
      local_38 = local_34[0];
      pcVar13 = this->currentChar;
      this->currentChar = pcVar13 + 1;
      BVar8 = Js::NumberUtilities::FHexDigit(*pcVar13,local_34);
      iVar5 = local_34[0];
      if (BVar8 == 0) goto LAB_00a39d68;
      pcVar13 = this->currentChar;
      this->currentChar = pcVar13 + 1;
      BVar8 = Js::NumberUtilities::FHexDigit(*pcVar13,local_34);
      iVar6 = local_34[0];
      if (BVar8 == 0) goto LAB_00a39d68;
      pcVar13 = this->currentChar;
      this->currentChar = pcVar13 + 1;
      BVar8 = Js::NumberUtilities::FHexDigit(*pcVar13,local_34);
      if (BVar8 == 0) goto LAB_00a39d68;
      uVar15 = iVar6 * 0x10 + iVar5 * 0x100 + local_38 * 0x1000 + local_34[0];
      if (0xffff < uVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                           ,0x14a,"(chcode == (chcode & 0xFFFF))","Bad unicode code");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      break;
    default:
      if (((uVar15 != 0x22) && (uVar15 != 0x2f)) && (uVar15 != 0x5c)) {
        if (uVar15 == 0x62) {
          uVar15 = 8;
        }
        else {
          if (uVar15 != 0x66) {
            if (cVar3 != L'\0') goto switchD_00a39b59_caseD_6f;
            this->currentChar = pcVar1;
            goto LAB_00a39d7d;
          }
          uVar15 = 0xc;
        }
      }
    }
    pRVar10 = GetCurrentRangeCharacterPairList(this);
    local_44.m_rangeStart = (uint)((ulong)((long)pcVar12 - (long)this->inputText) >> 1);
    local_44.m_char = (char16)uVar15;
    local_44.m_rangeLength = uVar14;
    JsUtil::
    List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pRVar10,&local_44);
    puVar2 = &this->currentIndex;
    uVar15 = *puVar2;
    *puVar2 = *puVar2 + uVar14 + 1;
    if (CARRY4(uVar15,uVar14 + 1)) {
LAB_00a39d63:
      Js::Throw::OutOfMemory();
    }
    pcVar12 = this->currentChar;
    bVar7 = false;
    uVar14 = 0;
    pcVar13 = pcVar12;
  } while( true );
}

Assistant:

tokens JSONScanner::ScanString()
    {
        char16 ch;

        this->currentIndex = 0;
        this->currentString = const_cast<char16*>(currentChar);
        bool endFound = false;
        bool isStringDirectInputTextMapped = true;
        LPCWSTR bulkStart = currentChar;
        uint bulkLength = 0;

        while (currentChar < inputText + inputLen)
        {
            ch = ReadNextChar();
            int tempHex;

            if (ch == '"')
            {
                //end of the string
                endFound = true;
                break;
            }
            else if (ch <= 0x1F)
            {
                //JSON doesn't accept \u0000 - \u001f range, LS(\u2028) and PS(\u2029) are ok
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }
            else if ( 0 == ch )
            {
                currentChar--;
               ThrowSyntaxError(JSERR_JsonNoStrEnd);
            }
            else if ('\\' == ch)
            {
                //JSON escape sequence in a string \", \/, \\, \b, \f, \n, \r, \t, unicode seq
                // unlikely V5.8 regular chars are not escaped, i.e '\g'' in a string is illegal not 'g'
                if (currentChar >= inputText + inputLen )
                {
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);
                }

                ch = ReadNextChar();
                switch (ch)
                {
                case 0:
                    currentChar--;
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);

                case '"':
                case '/':
                case '\\':
                    //keep ch
                    break;

                case 'b':
                    ch = 0x08;
                    break;

                case 'f':
                    ch = 0x0C;
                    break;

                case 'n':
                    ch = 0x0A;
                    break;

                case 'r':
                    ch = 0x0D;
                    break;

                case 't':
                    ch = 0x09;
                    break;

                case 'u':
                    {
                        int chcode;
                        // 4 hex digits
                        if (currentChar + 3 >= inputText + inputLen)
                        {
                            //no room left for 4 hex chars
                           ThrowSyntaxError(JSERR_JsonNoStrEnd);

                        }
                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode = tempHex * 0x1000;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0100;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0010;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex;
                        AssertMsg(chcode == (chcode & 0xFFFF), "Bad unicode code");
                        ch = (char16)chcode;
                    }
                    break;

                default:
                    // Any other '\o' is an error in JSON
                   ThrowSyntaxError(JSERR_JsonIllegalChar);
                }

                // flush
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, ch));

                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                currentIndex++;

                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }

                // mark the mode as 'string transformed' (no direct mapping in inputText possible)
                isStringDirectInputTextMapped = false;

                // reset (to next char)
                bulkStart = currentChar;
                bulkLength = 0;
            }
            else
            {
                // continue
                bulkLength++;
            }
        }

        if (!endFound)
        {
            // no ending '"' found
           ThrowSyntaxError(JSERR_JsonNoStrEnd);
        }

        if (isStringDirectInputTextMapped == false)
        {
            // If the last bulk is not ended with an escape character, make sure that is
            // not built into the final unescaped string
            bool shouldSkipLastCharacter = false;
            if (bulkLength > 0)
            {
                shouldSkipLastCharacter = true;
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, _u('\0')));
                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }
            }

            this->BuildUnescapedString(shouldSkipLastCharacter);
            this->GetCurrentRangeCharacterPairList()->Clear();
            this->currentString = this->stringBuffer;
        }
        else
        {
            // make currentIndex the length (w/o the \0)
            currentIndex = bulkLength;

            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("ScanString(): direct-mapped string as '%.*s'\n"),
                GetCurrentStringLen(), GetCurrentString());
        }

        return (pToken->tk = tkStrCon);
    }